

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::rowsInserted(QFileDialogPrivate *this,QModelIndex *parent)

{
  QFileDialogTreeView *this_00;
  char cVar1;
  QItemSelectionModel *pQVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = ((this->qFileDialogUi).d)->treeView;
  if (this_00 != (QFileDialogTreeView *)0x0) {
    QAbstractItemView::rootIndex(&local_38,(QAbstractItemView *)this_00);
    if ((((parent->r == local_38.r) && (parent->c == local_38.c)) && (parent->i == local_38.i)) &&
       ((parent->m).ptr == local_38.m.ptr)) {
      pQVar2 = QAbstractItemView::selectionModel
                         ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
      if (pQVar2 != (QItemSelectionModel *)0x0) {
        QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
        cVar1 = QItemSelectionModel::hasSelection();
        if (cVar1 == '\0') {
          pQVar3 = QAbstractItemView::model
                             ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
          (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,parent);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::rowsInserted(const QModelIndex &parent)
{
    if (!qFileDialogUi->treeView
        || parent != qFileDialogUi->treeView->rootIndex()
        || !qFileDialogUi->treeView->selectionModel()
        || qFileDialogUi->treeView->selectionModel()->hasSelection()
        || qFileDialogUi->treeView->model()->rowCount(parent) == 0)
        return;
}